

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void r4k_helper_tlbr_mips(CPUMIPSState *env)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uint64_t uVar8;
  bool bVar9;
  uint local_38;
  uint local_34;
  uint local_30;
  int idx;
  r4k_tlb_t *tlb;
  uint32_t tlb_mmid;
  uint32_t MMID;
  uint16_t ASID;
  _Bool mi;
  CPUMIPSState *env_local;
  
  bVar9 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  local_30 = env->CP0_MemoryMapID;
  if (bVar9) {
    local_30 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  puVar7 = (uint *)((long)&env->tlb->mmu +
                   (long)(int)((env->CP0_Index & 0x7fffffffU) % env->tlb->nb_tlb) * 0x28);
  if (bVar9) {
    local_34 = (uint)(ushort)puVar7[2];
  }
  else {
    local_34 = puVar7[3];
  }
  if (local_30 != local_34) {
    cpu_mips_tlb_flush_mips(env);
  }
  r4k_mips_tlb_flush_extra(env,env->tlb->nb_tlb);
  if ((short)puVar7[4] < 0) {
    env->CP0_EntryHi = 0x400;
    env->CP0_PageMask = 0;
    env->CP0_EntryLo0 = 0;
    env->CP0_EntryLo1 = 0;
  }
  else {
    if (bVar9) {
      local_38 = *puVar7 | (uint)(ushort)puVar7[2];
    }
    else {
      local_38 = *puVar7;
    }
    env->CP0_EntryHi = local_38;
    env->CP0_MemoryMapID = puVar7[3];
    env->CP0_PageMask = puVar7[1];
    uVar1 = puVar7[4];
    uVar2 = puVar7[4];
    uVar3 = puVar7[4];
    uVar4 = puVar7[4];
    uVar5 = puVar7[4];
    uVar6 = puVar7[4];
    uVar8 = get_entrylo_pfn_from_tlb(*(ulong *)(puVar7 + 6) >> 0xc);
    env->CP0_EntryLo0 =
         (long)(int)((uint)((ushort)uVar1 & 1) | (uint)((ushort)uVar2 >> 7 & 1) << 1 |
                    (uint)((ushort)uVar3 >> 9 & 1) << 2) | (ulong)((ushort)uVar4 >> 0xd & 1) << 0x1f
         | (ulong)((ushort)uVar5 >> 0xb & 1) << 0x1e |
         (long)(int)((uint)((ushort)uVar6 >> 1 & 7) << 3) | uVar8;
    uVar1 = puVar7[4];
    uVar2 = puVar7[4];
    uVar3 = puVar7[4];
    uVar4 = puVar7[4];
    uVar5 = puVar7[4];
    uVar6 = puVar7[4];
    uVar8 = get_entrylo_pfn_from_tlb(*(ulong *)(puVar7 + 8) >> 0xc);
    env->CP0_EntryLo1 =
         (long)(int)((uint)((ushort)uVar1 & 1) | (uint)((ushort)uVar2 >> 8 & 1) << 1 |
                    (uint)((ushort)uVar3 >> 10 & 1) << 2) |
         (ulong)((ushort)uVar4 >> 0xe & 1) << 0x1f | (ulong)((ushort)uVar5 >> 0xc & 1) << 0x1e |
         (long)(int)((uint)((ushort)uVar6 >> 4 & 7) << 3) | uVar8;
  }
  return;
}

Assistant:

void r4k_helper_tlbr(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;
    idx = (env->CP0_Index & ~0x80000000) % env->tlb->nb_tlb;
    tlb = &env->tlb->mmu.r4k.tlb[idx];

    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    /* If this will change the current ASID/MMID, flush qemu's TLB.  */
    if (MMID != tlb_mmid) {
        cpu_mips_tlb_flush(env);
    }

    r4k_mips_tlb_flush_extra(env, env->tlb->nb_tlb);

    if (tlb->EHINV) {
        env->CP0_EntryHi = 1 << CP0EnHi_EHINV;
        env->CP0_PageMask = 0;
        env->CP0_EntryLo0 = 0;
        env->CP0_EntryLo1 = 0;
    } else {
        env->CP0_EntryHi = mi ? tlb->VPN : tlb->VPN | tlb->ASID;
        env->CP0_MemoryMapID = tlb->MMID;
        env->CP0_PageMask = tlb->PageMask;
        env->CP0_EntryLo0 = tlb->G | (tlb->V0 << 1) | (tlb->D0 << 2) |
                        ((uint64_t)tlb->RI0 << CP0EnLo_RI) |
                        ((uint64_t)tlb->XI0 << CP0EnLo_XI) | (tlb->C0 << 3) |
                        get_entrylo_pfn_from_tlb(tlb->PFN[0] >> 12);
        env->CP0_EntryLo1 = tlb->G | (tlb->V1 << 1) | (tlb->D1 << 2) |
                        ((uint64_t)tlb->RI1 << CP0EnLo_RI) |
                        ((uint64_t)tlb->XI1 << CP0EnLo_XI) | (tlb->C1 << 3) |
                        get_entrylo_pfn_from_tlb(tlb->PFN[1] >> 12);
    }
}